

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O0

uint luaO_tostringbuff(TValue *obj,char *buff)

{
  uint local_1c;
  int len;
  char *buff_local;
  TValue *obj_local;
  
  if (obj->tt_ == '\x03') {
    local_1c = snprintf(buff,0x40,"%lld",(obj->value_).gc);
  }
  else {
    local_1c = tostringbuffFloat((obj->value_).n,buff);
  }
  return local_1c;
}

Assistant:

unsigned luaO_tostringbuff (const TValue *obj, char *buff) {
  int len;
  lua_assert(ttisnumber(obj));
  if (ttisinteger(obj))
    len = lua_integer2str(buff, LUA_N2SBUFFSZ, ivalue(obj));
  else
    len = tostringbuffFloat(fltvalue(obj), buff);
  lua_assert(len < LUA_N2SBUFFSZ);
  return cast_uint(len);
}